

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

bool FIX::double_conversion::FastFixedDtoa
               (double v,int fractional_count,Vector<char> buffer,int *length,int *decimal_point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  uint64_t d64;
  ulong uVar4;
  uint uVar5;
  uint32_t number;
  int iVar6;
  ulong uVar7;
  ulong uVar9;
  double_conversion *this;
  byte bVar10;
  char *pcVar11;
  double_conversion *pdVar12;
  long lVar13;
  uint uVar14;
  int *in_R9;
  int iVar15;
  bool bVar16;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  undefined3 in_stack_ffffffffffffffc0;
  undefined4 uVar17;
  ulong uVar8;
  
  pcVar11 = buffer.start_;
  uVar5 = buffer.length_;
  bVar16 = ((ulong)v & 0x7ff0000000000000) == 0;
  this = (double_conversion *)((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar16) {
    this = (double_conversion *)((ulong)v & 0xfffffffffffff);
  }
  uVar14 = 0xfffffbce;
  if (!bVar16) {
    uVar14 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  bVar16 = fractional_count < 0x15 && (int)uVar14 < 0x15;
  if (fractional_count >= 0x15 || (int)uVar14 >= 0x15) {
    return bVar16;
  }
  *length = 0;
  uVar17 = CONCAT13(bVar16,in_stack_ffffffffffffffc0);
  bVar10 = (byte)uVar14;
  number = (uint32_t)buffer.start_;
  if ((int)uVar14 < 0xc) {
    auVar3 = buffer._0_12_;
    if (-1 < (int)uVar14) {
      buffer_00._12_4_ = 0;
      buffer_00.start_ = (char *)auVar3._0_8_;
      buffer_00.length_ = auVar3._8_4_;
      FillDigits64((long)this << (bVar10 & 0x3f),buffer_00,length);
      iVar15 = *length;
      goto LAB_0016d7f8;
    }
    if (uVar14 < 0xffffffcc) {
      if (0xffffff7f < uVar14) {
        *decimal_point = 0;
        goto LAB_0016d985;
      }
      if ((int)uVar5 < 1) goto LAB_0016d998;
      *pcVar11 = '\0';
      *length = 0;
      *decimal_point = -fractional_count;
    }
    else {
      pdVar12 = (double_conversion *)((ulong)this >> (-bVar10 & 0x3f));
      this = this + -((long)pdVar12 << (-bVar10 & 0x3f));
      if ((ulong)pdVar12 >> 0x20 == 0) {
        buffer_03.start_ = (char *)(ulong)uVar5;
        buffer_03._8_8_ = length;
        FillDigits32(pdVar12,number,buffer_03,(int *)(ulong)(uint)fractional_count);
      }
      else {
        buffer_01._12_4_ = 0;
        buffer_01.start_ = (char *)auVar3._0_8_;
        buffer_01.length_ = auVar3._8_4_;
        FillDigits64((uint64_t)pdVar12,buffer_01,length);
      }
      *decimal_point = *length;
LAB_0016d985:
      buffer_07.start_ = (char *)(ulong)uVar5;
      buffer_07._8_8_ = length;
      FillFractionals(this,(ulong)uVar14,fractional_count,number,buffer_07,decimal_point,
                      (int *)CONCAT44(fractional_count,uVar17));
    }
  }
  else {
    if (uVar14 < 0x12) {
      uVar9 = 0xb1a2bc2ec5 << (0x11 - bVar10 & 0x3f);
      pdVar12 = (double_conversion *)((ulong)this / uVar9);
      uVar9 = (ulong)this % uVar9 << (bVar10 & 0x3f);
    }
    else {
      uVar9 = (long)this << (bVar10 - 0x11 & 0x3f);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar9;
      pdVar12 = (double_conversion *)(SUB168(auVar1 * ZEXT816(0x5c3bd5191b525a25),8) >> 0x26);
      uVar9 = (uVar9 + (long)pdVar12 * -0xb1a2bc2ec5) * 0x20000;
    }
    buffer_02.start_ = (char *)(ulong)uVar5;
    buffer_02._8_8_ = length;
    FillDigits32(pdVar12,number,buffer_02,(int *)(ulong)(uint)fractional_count);
    iVar15 = (int)(uVar9 / 10000000);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9 / 10000000;
    buffer_04.start_ = (char *)(ulong)uVar5;
    buffer_04._8_8_ = length;
    FillDigits32FixedLength((double_conversion *)(uVar9 / 100000000000000),3,number,buffer_04,in_R9)
    ;
    buffer_05.start_ = (char *)(ulong)uVar5;
    buffer_05._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)
               (ulong)(uint)(iVar15 + SUB164(auVar2 * ZEXT816(0x1ad7f29abcb),8) * -10000000),7,
               number,buffer_05,in_R9);
    buffer_06.start_ = (char *)(ulong)uVar5;
    buffer_06._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)(ulong)(uint)((int)uVar9 + iVar15 * -10000000),7,number,
               buffer_06,in_R9);
    iVar15 = *length;
LAB_0016d7f8:
    *decimal_point = iVar15;
  }
  uVar14 = *length;
  uVar9 = (ulong)(int)uVar14;
  if (0 < (long)uVar9) {
    if ((int)uVar5 < (int)uVar14) goto LAB_0016d998;
    if (pcVar11[uVar9 - 1] == '0') {
      do {
        *length = (int)uVar9 + -1;
        if (uVar9 < 2) {
          uVar14 = (int)uVar9 - 1;
          goto LAB_0016d8f1;
        }
        uVar4 = uVar9 - 1;
        lVar13 = uVar9 - 2;
        uVar9 = uVar4;
      } while (pcVar11[lVar13] == '0');
      if (0 < (long)uVar4) goto LAB_0016d84f;
    }
    else {
      uVar4 = (ulong)uVar14;
LAB_0016d84f:
      iVar15 = (int)uVar4;
      uVar7 = 0;
      do {
        if (uVar5 == uVar7) goto LAB_0016d998;
        uVar8 = uVar7;
      } while ((pcVar11[uVar7] == '0') && (uVar7 = uVar7 + 1, uVar8 = uVar9, uVar9 != uVar7));
      iVar6 = (int)uVar8;
      if (iVar6 != 0) {
        if (iVar6 < iVar15) {
          lVar13 = 0;
          uVar9 = uVar8 & 0xffffffff;
          do {
            if (((int)uVar5 <= (int)uVar9) || ((int)uVar5 <= lVar13)) goto LAB_0016d998;
            pcVar11[lVar13] = pcVar11[lVar13 + uVar8];
            iVar15 = *length;
            uVar14 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar14;
            lVar13 = lVar13 + 1;
          } while ((int)uVar14 < iVar15);
        }
        *length = iVar15 - iVar6;
        *decimal_point = *decimal_point - iVar6;
        uVar14 = *length;
        goto LAB_0016d8f1;
      }
    }
    uVar14 = (uint)uVar4;
  }
LAB_0016d8f1:
  if ((-1 < (int)uVar14) && ((int)uVar14 < (int)uVar5)) {
    pcVar11[uVar14] = '\0';
    if (*length == 0) {
      *decimal_point = -fractional_count;
    }
    return (bool)(char)((uint)uVar17 >> 0x18);
  }
LAB_0016d998:
  __assert_fail("0 <= index && index < length_",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0xcc,"T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimick
    // Gay's dtoa and and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}